

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::Trans4x4WHT_MemCheck_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::Trans4x4WHT_MemCheck_Test> *this)

{
  Trans4x4WHT *this_00;
  
  WithParamInterface<std::tuple<void(*)(short_const*,int*,int),void(*)(int_const*,unsigned_char*,int),unsigned_char,aom_bit_depth,int,void(*)(short_const*,int*,int)>>
  ::parameter_ = &this->parameter_;
  this_00 = (Trans4x4WHT *)operator_new(0x78);
  anon_unknown.dwarf_1a00963::Trans4x4WHT::Trans4x4WHT(this_00);
  (this_00->super_TransformTestBase<int>)._vptr_TransformTestBase =
       (_func_int **)&PTR__Trans4x4WHT_00f50940;
  (this_00->
  super_TestWithParam<std::tuple<void_(*)(const_short_*,_int_*,_int),_void_(*)(const_int_*,_unsigned_char_*,_int),_unsigned_char,_aom_bit_depth,_int,_void_(*)(const_short_*,_int_*,_int)>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__Trans4x4WHT_MemCheck_Test_00f50980;
  (this_00->
  super_TestWithParam<std::tuple<void_(*)(const_short_*,_int_*,_int),_void_(*)(const_int_*,_unsigned_char_*,_int),_unsigned_char,_aom_bit_depth,_int,_void_(*)(const_short_*,_int_*,_int)>_>
  ).
  super_WithParamInterface<std::tuple<void_(*)(const_short_*,_int_*,_int),_void_(*)(const_int_*,_unsigned_char_*,_int),_unsigned_char,_aom_bit_depth,_int,_void_(*)(const_short_*,_int_*,_int)>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__Trans4x4WHT_MemCheck_Test_00f509c0;
  return &(this_00->
          super_TestWithParam<std::tuple<void_(*)(const_short_*,_int_*,_int),_void_(*)(const_int_*,_unsigned_char_*,_int),_unsigned_char,_aom_bit_depth,_int,_void_(*)(const_short_*,_int_*,_int)>_>
          ).super_Test;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }